

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O1

void __thiscall SmallVector_ElementAccess_Test::TestBody(SmallVector_ElementAccess_Test *this)

{
  int *piVar1;
  int *piVar2;
  size_t index;
  size_t n;
  long lVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70;
  small_vector<int,_4UL> local_50;
  
  local_50.buffer_ = local_50.small_buffer_._M_elems;
  local_50.elements_ = 4;
  local_50.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_50.small_buffer_._M_elems[0] = 0;
  local_50.small_buffer_._M_elems[1] = 0;
  local_50.small_buffer_._M_elems[2] = 0;
  local_50.small_buffer_._M_elems[3] = 0;
  local_50.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_50.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  n = 0;
  do {
    piVar2 = pstore::small_vector<int,4ul>::index<pstore::small_vector<int,4ul>&,int>(&local_50,n);
    *piVar2 = (int)n + 0x2a;
    n = n + 1;
  } while (n != 4);
  local_80[0] = (internal)(local_50.elements_ == 0);
  if (!(bool)local_80[0]) {
    if (*local_50.buffer_ == 0x2a) {
      lVar3 = 4;
      do {
        local_80[0] = (internal)(local_50.elements_ << 2 == lVar3);
        if ((bool)local_80[0]) goto LAB_00166d7e;
        piVar2 = (int *)((long)local_50.buffer_ + lVar3);
        piVar1 = (int *)(&DAT_001ff360 + lVar3);
        lVar3 = lVar3 + 4;
      } while (*piVar2 == *piVar1);
    }
    local_80[0] = (internal)0x0;
  }
LAB_00166d7e:
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,local_80,
               (AssertionResult *)
               "std::equal (std::begin (buffer), std::end (buffer), std::begin (expected))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0xe3,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  if (local_50.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST (SmallVector, ElementAccess) {
    pstore::small_vector<int, 4> buffer (std::size_t{4});
    int count = 42;
    for (std::size_t index = 0, end = buffer.size (); index != end; ++index) {
        buffer[index] = count++;
    }

    std::array<int, 4> const expected{{42, 43, 44, 45}};
    EXPECT_TRUE (std::equal (std::begin (buffer), std::end (buffer), std::begin (expected)));
}